

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O1

void generateNative<false>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  Instruction instr;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  Program prog;
  uint8_t scratchpad [262144];
  Instruction IStack_40330;
  undefined1 auStack_40328 [64];
  undefined8 auStack_402e8 [4];
  uint32_t uStack_402c1;
  undefined4 uStack_402a0;
  Instruction aIStack_40298 [16];
  Instruction aIStack_40218 [64];
  undefined1 auStack_40018 [262144];
  
  puVar2 = blockTemplate_;
  puVar3 = auStack_402e8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + 8;
    puVar3 = puVar3 + 1;
  }
  uStack_402a0 = 0x961d561;
  uStack_402c1 = nonce;
  blake2b(auStack_40328,0x40,auStack_402e8,0x4c,(void *)0x0,0);
  fillAes1Rx4<false>(auStack_40328,0x40000,auStack_40018);
  fillAes1Rx4<false>(auStack_40328,0x280,aIStack_40298);
  lVar1 = 0x10;
  do {
    IStack_40330 = aIStack_40218[lVar1 + -0x10];
    defyx::Instruction::print(&IStack_40330,(ostream *)&std::cout);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x50);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void generateNative(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[defyx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, defyx::ScratchpadSize, scratchpad);
	alignas(16) defyx::Program prog;
	fillAes1Rx4<softAes>((void*)hash, sizeof(prog), &prog);
	std::cout << prog << std::endl;
}